

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

string * __thiscall
Search::search::pretty_label_abi_cxx11_(string *__return_storage_ptr__,search *this,action a)

{
  namedlabels *this_00;
  substring sVar1;
  ostringstream os;
  ostringstream local_190 [376];
  
  this_00 = this->priv->all->sd->ldict;
  if (this_00 == (namedlabels *)0x0) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::ostream::_M_insert<unsigned_long>((ulong)local_190);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  else {
    sVar1 = namedlabels::get(this_00,a);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,sVar1.begin,sVar1.end);
  }
  return __return_storage_ptr__;
}

Assistant:

string search::pretty_label(action a)
{
  if (this->priv->all->sd->ldict)
  {
    substring ss = this->priv->all->sd->ldict->get(a);
    return string(ss.begin, ss.end - ss.begin);
  }
  else
  {
    ostringstream os;
    os << a;
    return os.str();
  }
}